

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_objlen(lua_State *L,StkId ra,TValue *rb)

{
  Table *t;
  Table *events;
  uint uVar1;
  int iVar2;
  TValue *f;
  TValue *io;
  
  uVar1 = rb->tt_ & 0xf;
  if (uVar1 == 4) {
    (ra->value_).n =
         ((double)CONCAT44(0x45300000,(int)((ulong)*(undefined8 *)((rb->value_).f + 0x10) >> 0x20))
         - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)*(undefined8 *)((rb->value_).f + 0x10)) -
         4503599627370496.0);
LAB_00111d0c:
    ra->tt_ = 3;
    return;
  }
  if (uVar1 == 5) {
    t = (Table *)(rb->value_).f;
    events = t->metatable;
    if ((events == (Table *)0x0) || ((events->flags & 0x10) != 0)) {
      f = (TValue *)0x0;
    }
    else {
      f = luaT_gettm(events,TM_LEN,L->l_G->tmname[4]);
    }
    if (f == (TValue *)0x0) {
      iVar2 = luaH_getn(t);
      (ra->value_).n = (double)iVar2;
      goto LAB_00111d0c;
    }
  }
  else {
    f = luaT_gettmbyobj(L,rb,TM_LEN);
    if (f->tt_ == 0) {
      luaG_typeerror(L,rb,"get length of");
    }
  }
  callTM(L,f,rb,rb,ra,1);
  return;
}

Assistant:

void luaV_objlen (lua_State *L, StkId ra, const TValue *rb) {
  const TValue *tm;
  switch (ttypenv(rb)) {
    case LUA_TTABLE: {
      Table *h = hvalue(rb);
      tm = fasttm(L, h->metatable, TM_LEN);
      if (tm) break;  /* metamethod? break switch to call it */
      setnvalue(ra, cast_num(luaH_getn(h)));  /* else primitive len */
      return;
    }
    case LUA_TSTRING: {
      setnvalue(ra, cast_num(tsvalue(rb)->len));
      return;
    }
    default: {  /* try metamethod */
      tm = luaT_gettmbyobj(L, rb, TM_LEN);
      if (ttisnil(tm))  /* no metamethod? */
        luaG_typeerror(L, rb, "get length of");
      break;
    }
  }
  callTM(L, tm, rb, rb, ra, 1);
}